

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

bool __thiscall MainWindow::maybeSave(MainWindow *this)

{
  bool bVar1;
  int iVar2;
  QFlags<QMessageBox::StandardButton> local_9c;
  Int local_98;
  QLatin1Char local_93;
  QChar local_92;
  QString local_90;
  QString local_68;
  QString local_50;
  QString local_38;
  int local_1c;
  MainWindow *pMStack_18;
  StandardButton result;
  MainWindow *this_local;
  
  pMStack_18 = this;
  bVar1 = Module::isModified(this->mModule);
  if (bVar1) {
    tr(&local_38,"Trackerboy",(char *)0x0,-1);
    tr(&local_68,"Save changes to %1?",(char *)0x0,-1);
    ModuleFile::name(&local_90,&this->mModuleFile);
    QLatin1Char::QLatin1Char(&local_93,' ');
    QChar::QChar(&local_92,local_93);
    QString::arg((QString *)&local_50,(int)&local_68,(QChar *)&local_90);
    local_9c = ::operator|(Save,Discard);
    local_98 = (Int)QFlags<QMessageBox::StandardButton>::operator|(&local_9c,Cancel);
    iVar2 = QMessageBox::warning
                      ((QWidget *)this,(QString *)&local_38,(QString *)&local_50,
                       (QFlags_conflict1 *)(ulong)(uint)local_98,NoButton);
    QString::~QString(&local_50);
    QString::~QString(&local_90);
    QString::~QString(&local_68);
    QString::~QString(&local_38);
    if (iVar2 == 0x800) {
      local_1c = iVar2;
      bVar1 = onFileSave(this);
      if (!bVar1) {
        return false;
      }
    }
    else if (iVar2 == 0x400000) {
      return false;
    }
  }
  return true;
}

Assistant:

bool MainWindow::maybeSave() {
    if (mModule->isModified()) {
        // prompt the user if they want to save any changes
        auto const result = QMessageBox::warning(
            this,
            tr("Trackerboy"),
            tr("Save changes to %1?").arg(mModuleFile.name()),
            QMessageBox::Save | QMessageBox::Discard | QMessageBox::Cancel
        );

        switch (result) {
            case QMessageBox::Save:
                if (!onFileSave()) {
                    // save failed, do not close document
                    return false;
                }
                break;
            case QMessageBox::Cancel:
                // user cancelled, do not close document
                return false;
            default:
                break;
        }
    }

    return true;
}